

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

KeyValue * __thiscall
google::protobuf::Arena::CreateInternalRawArray<google::protobuf::internal::ExtensionSet::KeyValue>
          (Arena *this,size_t num_elements)

{
  unsigned_long uVar1;
  LogMessage *pLVar2;
  KeyValue *pKVar3;
  size_t n;
  byte local_51;
  LogMessage local_50;
  size_t local_18;
  size_t num_elements_local;
  Arena *this_local;
  
  local_18 = num_elements;
  num_elements_local = (size_t)this;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  local_51 = 0;
  if (uVar1 >> 5 < num_elements) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
               ,0x26b);
    local_51 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                       );
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"Requested size is too large to fit into size_t.");
    internal::LogFinisher::operator=((LogFinisher *)((long)&n + 3),pLVar2);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  pKVar3 = (KeyValue *)
           AllocateAlignedWithHook
                     (this,local_18 << 5,8,(type_info *)&internal::ExtensionSet::KeyValue::typeinfo)
  ;
  return pKVar3;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* CreateInternalRawArray(size_t num_elements) {
    GOOGLE_CHECK_LE(num_elements, std::numeric_limits<size_t>::max() / sizeof(T))
        << "Requested size is too large to fit into size_t.";
    // We count on compiler to realize that if sizeof(T) is a multiple of
    // 8 AlignUpTo can be elided.
    const size_t n = sizeof(T) * num_elements;
    return static_cast<T*>(
        AllocateAlignedWithHook(n, alignof(T), RTTI_TYPE_ID(T)));
  }